

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_run_container_intersect(array_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  uint uVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  uint16_t *puVar14;
  int iVar15;
  uint uVar16;
  
  iVar2 = src_2->n_runs;
  prVar4 = src_2->runs;
  uVar9 = (uint)prVar4->value;
  if (prVar4->value == 0 && iVar2 == 1) {
    if (prVar4->length == 0xffff) {
      return src_1->cardinality != 0;
    }
  }
  else if (iVar2 == 0) {
    return false;
  }
  iVar3 = src_1->cardinality;
  uVar6 = 0;
  if (iVar3 < 1) {
    return false;
  }
  uVar11 = (uint)prVar4->length;
  puVar5 = src_1->array;
  iVar10 = 0;
  do {
    uVar1 = puVar5[(int)uVar6];
    if (uVar11 + uVar9 < (uint)uVar1) {
      puVar14 = &prVar4[(long)iVar10 + 1].length;
      do {
        if (iVar2 + -1 == iVar10) {
          return false;
        }
        uVar9 = (uint)((rle16_t *)(puVar14 + -1))->value;
        uVar11 = (uint)*puVar14;
        puVar14 = puVar14 + 2;
        iVar10 = iVar10 + 1;
      } while (uVar9 + uVar11 < (uint)uVar1);
    }
    uVar8 = (ushort)uVar9;
    if (uVar8 <= uVar1) {
      return true;
    }
    uVar16 = uVar6 + 1;
    uVar13 = uVar16;
    if (((int)uVar16 < iVar3) && (puVar5[(int)uVar16] < uVar8)) {
      uVar6 = uVar6 + 2;
      iVar7 = 1;
      if ((int)uVar6 < iVar3) {
        iVar15 = 1;
        do {
          uVar12 = puVar5[(int)uVar6];
          iVar7 = iVar15;
          if (uVar8 <= uVar12) goto LAB_0010deb4;
          iVar7 = iVar15 * 2;
          uVar6 = uVar16 + iVar15 * 2;
          iVar15 = iVar7;
        } while ((int)uVar6 < iVar3);
      }
      uVar12 = puVar5[iVar3 - 1U];
      uVar6 = iVar3 - 1U;
LAB_0010deb4:
      uVar13 = uVar6;
      if (uVar12 != uVar8) {
        if (uVar12 < uVar8) {
          return uVar8 <= uVar1;
        }
        if ((iVar7 >> 1) + uVar16 + 1 != uVar6) {
          uVar16 = (iVar7 >> 1) + uVar16;
          do {
            uVar13 = (int)(uVar16 + uVar6) >> 1;
            if (puVar5[(int)uVar13] == uVar8) break;
            if (puVar5[(int)uVar13] < uVar8) {
              uVar16 = uVar13;
              uVar13 = uVar6;
            }
            uVar6 = uVar13;
            uVar13 = uVar6;
          } while (uVar16 + 1 != uVar6);
        }
      }
    }
    uVar6 = uVar13;
    if (iVar3 <= (int)uVar6) {
      return uVar8 <= uVar1;
    }
  } while( true );
}

Assistant:

bool array_run_container_intersect(const array_container_t *src_1,
                                      const run_container_t *src_2) {
	if( run_container_is_full(src_2) ) {
	    return !array_container_empty(src_1);
	}
	if (src_2->n_runs == 0) {
        return false;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return false;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            return true;
        }
    }
    return false;
}